

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

int Pdr_InvUsedFlopNum(Vec_Int_t *vInv)

{
  Vec_Int_t *__ptr;
  long lVar1;
  int iVar2;
  
  __ptr = Pdr_InvCounts(vInv);
  if ((long)__ptr->nSize < 1) {
    iVar2 = 0;
  }
  else {
    lVar1 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)(__ptr->pArray[lVar1] == 0);
      lVar1 = lVar1 + 1;
    } while (__ptr->nSize != lVar1);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if ((long)vInv->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  return vInv->pArray[(long)vInv->nSize + -1] - iVar2;
}

Assistant:

int Pdr_InvUsedFlopNum( Vec_Int_t * vInv )
{
    Vec_Int_t * vCounts = Pdr_InvCounts( vInv );
    int nZeros = Vec_IntCountZero( vCounts );
    Vec_IntFree( vCounts );
    return Vec_IntEntryLast(vInv) - nZeros;
}